

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
::reserve(raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
          *this,size_t n)

{
  rehash(this,n + (long)(n - 1) / 7);
  return;
}

Assistant:

inline size_t GrowthToLowerboundCapacity(size_t growth)
		{
			// `growth*8/7`
			PHMAP_IF_CONSTEXPR (Group::kWidth == 8) {
				if (growth == 7) {
					// x+(x-1)/7 does not work when x==7.
					return 8;
				}
			}
			return growth + static_cast<size_t>((static_cast<int64_t>(growth) - 1) / 7);
		}